

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphan-test.c++
# Opt level: O2

void __thiscall capnp::_::anon_unknown_0::TestCase133::run(TestCase133 *this)

{
  bool bVar1;
  Reader value;
  char *local_1a8;
  DebugExpression<bool> _kjCondition;
  undefined7 uStack_19f;
  bool local_178;
  bool local_170;
  ArrayPtr<const_char> local_168;
  Orphan<capnp::Text> orphan;
  Builder root;
  MallocMessageBuilder builder;
  
  MallocMessageBuilder::MallocMessageBuilder(&builder,0x400,GROW_HEURISTICALLY);
  MessageBuilder::initRoot<capnproto_test::capnp::test::TestAllTypes>
            (&root,&builder.super_MessageBuilder);
  value.super_StringPtr.content.size_ = 4;
  value.super_StringPtr.content.ptr = "foo";
  capnproto_test::capnp::test::TestAllTypes::Builder::setTextField(&root,value);
  bVar1 = capnproto_test::capnp::test::TestAllTypes::Builder::hasTextField(&root);
  _kjCondition.value = bVar1;
  if (kj::_::Debug::minSeverity < 3 && !bVar1) {
    kj::_::Debug::log<char_const(&)[37],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x8a,ERROR,"\"failed: expected \" \"root.hasTextField()\", _kjCondition",
               (char (*) [37])"failed: expected root.hasTextField()",&_kjCondition);
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::disownTextField(&orphan,&root);
  __kjCondition = (Orphan<capnp::Text> *)CONCAT71(uStack_19f,orphan.builder.location != (word *)0x0)
  ;
  if ((orphan.builder.location == (word *)0x0) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[38],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x8d,ERROR,"\"failed: expected \" \"!(orphan == nullptr)\", _kjCondition",
               (char (*) [38])"failed: expected !(orphan == nullptr)",&_kjCondition);
  }
  local_1a8 = "foo";
  local_168 = (ArrayPtr<const_char>)OrphanBuilder::asTextReader(&orphan.builder);
  kj::_::DebugExpression<char_const(&)[4]>::operator==
            ((DebugComparison<const_char_(&)[4],_capnp::Text::Reader> *)&_kjCondition,
             (DebugExpression<char_const(&)[4]> *)&local_1a8,(Reader *)&local_168);
  if ((local_178 == false) && (kj::_::Debug::minSeverity < 3)) {
    local_168 = (ArrayPtr<const_char>)OrphanBuilder::asTextReader(&orphan.builder);
    kj::_::Debug::
    log<char_const(&)[49],kj::_::DebugComparison<char_const(&)[4],capnp::Text::Reader>&,char_const(&)[4],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x8f,ERROR,
               "\"failed: expected \" \"(\\\"foo\\\") == (orphan.getReader())\", _kjCondition, \"foo\", orphan.getReader()"
               ,(char (*) [49])"failed: expected (\"foo\") == (orphan.getReader())",
               (DebugComparison<const_char_(&)[4],_capnp::Text::Reader> *)&_kjCondition,
               (char (*) [4])"foo",(Reader *)&local_168);
  }
  local_1a8 = "foo";
  OrphanBuilder::asText((Builder *)&local_168,&orphan.builder);
  kj::_::DebugExpression<char_const(&)[4]>::operator==
            ((DebugComparison<const_char_(&)[4],_capnp::Text::Builder> *)&_kjCondition,
             (DebugExpression<char_const(&)[4]> *)&local_1a8,(Builder *)&local_168);
  if ((local_170 == false) && (kj::_::Debug::minSeverity < 3)) {
    OrphanBuilder::asText((Builder *)&local_168,&orphan.builder);
    kj::_::Debug::
    log<char_const(&)[43],kj::_::DebugComparison<char_const(&)[4],capnp::Text::Builder>&,char_const(&)[4],capnp::Text::Builder>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x90,ERROR,
               "\"failed: expected \" \"(\\\"foo\\\") == (orphan.get())\", _kjCondition, \"foo\", orphan.get()"
               ,(char (*) [43])"failed: expected (\"foo\") == (orphan.get())",
               (DebugComparison<const_char_(&)[4],_capnp::Text::Builder> *)&_kjCondition,
               (char (*) [4])"foo",(Builder *)&local_168);
  }
  bVar1 = capnproto_test::capnp::test::TestAllTypes::Builder::hasTextField(&root);
  __kjCondition = (Orphan<capnp::Text> *)CONCAT71(uStack_19f,!bVar1);
  if (bVar1 && kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[40],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x91,ERROR,"\"failed: expected \" \"!(root.hasTextField())\", _kjCondition",
               (char (*) [40])"failed: expected !(root.hasTextField())",&_kjCondition);
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::adoptTextField(&root,&orphan);
  __kjCondition = &orphan;
  if ((orphan.builder.location != (word *)0x0) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::
    log<char_const(&)[35],kj::_::DebugComparison<capnp::Orphan<capnp::Text>&,decltype(nullptr)>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x94,ERROR,"\"failed: expected \" \"orphan == nullptr\", _kjCondition",
               (char (*) [35])"failed: expected orphan == nullptr",
               (DebugComparison<capnp::Orphan<capnp::Text>_&,_std::nullptr_t> *)&_kjCondition);
  }
  bVar1 = capnproto_test::capnp::test::TestAllTypes::Builder::hasTextField(&root);
  __kjCondition = (Orphan<capnp::Text> *)CONCAT71(uStack_19f,bVar1);
  if (kj::_::Debug::minSeverity < 3 && !bVar1) {
    kj::_::Debug::log<char_const(&)[37],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x95,ERROR,"\"failed: expected \" \"root.hasTextField()\", _kjCondition",
               (char (*) [37])"failed: expected root.hasTextField()",&_kjCondition);
  }
  local_1a8 = "foo";
  capnproto_test::capnp::test::TestAllTypes::Builder::getTextField((Builder *)&local_168,&root);
  kj::_::DebugExpression<char_const(&)[4]>::operator==
            ((DebugComparison<const_char_(&)[4],_capnp::Text::Builder> *)&_kjCondition,
             (DebugExpression<char_const(&)[4]> *)&local_1a8,(Builder *)&local_168);
  if ((local_170 == false) && (kj::_::Debug::minSeverity < 3)) {
    capnproto_test::capnp::test::TestAllTypes::Builder::getTextField((Builder *)&local_168,&root);
    kj::_::Debug::
    log<char_const(&)[50],kj::_::DebugComparison<char_const(&)[4],capnp::Text::Builder>&,char_const(&)[4],capnp::Text::Builder>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x96,ERROR,
               "\"failed: expected \" \"(\\\"foo\\\") == (root.getTextField())\", _kjCondition, \"foo\", root.getTextField()"
               ,(char (*) [50])"failed: expected (\"foo\") == (root.getTextField())",
               (DebugComparison<const_char_(&)[4],_capnp::Text::Builder> *)&_kjCondition,
               (char (*) [4])"foo",(Builder *)&local_168);
  }
  OrphanBuilder::~OrphanBuilder(&orphan.builder);
  MallocMessageBuilder::~MallocMessageBuilder(&builder);
  return;
}

Assistant:

TEST(Orphans, Text) {
  MallocMessageBuilder builder;
  auto root = builder.initRoot<TestAllTypes>();

  root.setTextField("foo");
  EXPECT_TRUE(root.hasTextField());

  Orphan<Text> orphan = root.disownTextField();
  EXPECT_FALSE(orphan == nullptr);

  EXPECT_EQ("foo", orphan.getReader());
  EXPECT_EQ("foo", orphan.get());
  EXPECT_FALSE(root.hasTextField());

  root.adoptTextField(kj::mv(orphan));
  EXPECT_TRUE(orphan == nullptr);
  EXPECT_TRUE(root.hasTextField());
  EXPECT_EQ("foo", root.getTextField());
}